

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O3

void xercesc_4_0::DatatypeValidator::storeDV(XSerializeEngine *serEng,DatatypeValidator *dv)

{
  XMLCh *key1;
  bool bVar1;
  ulong uVar2;
  ulong in_RCX;
  void *__buf;
  undefined8 *puVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  DatatypeValidator *pDVar6;
  StringHasher *this;
  
  if (dv == (DatatypeValidator *)0x0) {
    XSerializeEngine::operator<<(serEng,-3);
    return;
  }
  key1 = dv->fTypeLocalName;
  if ((key1 == (XMLCh *)0x0) || (uVar2 = (ulong)(ushort)*key1, uVar2 == 0)) {
    uVar2 = 0;
  }
  else {
    in_RCX = *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18);
    XVar5 = key1[1];
    if (XVar5 != L'\0') {
      pXVar4 = key1 + 2;
      do {
        uVar2 = (ulong)(ushort)XVar5 + (uVar2 >> 0x18) + uVar2 * 0x26;
        XVar5 = *pXVar4;
        pXVar4 = pXVar4 + 1;
      } while (XVar5 != L'\0');
    }
    uVar2 = uVar2 % in_RCX;
  }
  puVar3 = *(undefined8 **)
            (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) + uVar2 * 8);
  if (puVar3 == (undefined8 *)0x0) {
    pDVar6 = (DatatypeValidator *)0x0;
  }
  else {
    this = (StringHasher *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x30);
    pDVar6 = (DatatypeValidator *)0x0;
    do {
      bVar1 = StringHasher::equals(this,key1,(void *)puVar3[2]);
      if (bVar1) {
        pDVar6 = (DatatypeValidator *)*puVar3;
        break;
      }
      puVar3 = (undefined8 *)puVar3[1];
    } while (puVar3 != (undefined8 *)0x0);
  }
  if (pDVar6 == dv) {
    XSerializeEngine::operator<<(serEng,-1);
    XSerializeEngine::writeString(serEng,dv->fTypeLocalName,0,false);
    return;
  }
  XSerializeEngine::operator<<(serEng,-2);
  XSerializeEngine::operator<<(serEng,dv->fType);
  XSerializeEngine::write(serEng,(int)dv,__buf,in_RCX);
  return;
}

Assistant:

void DatatypeValidator::storeDV(XSerializeEngine&        serEng
                              , DatatypeValidator* const dv)
{
    if (dv)
    {
        //builtIndv
        if (dv == DatatypeValidatorFactory::getBuiltInRegistry()->get(dv->getTypeLocalName()))
        {
            serEng<<DV_BUILTIN;
            serEng.writeString(dv->getTypeLocalName());
        }
        else
        {
            serEng<<DV_NORMAL;
            serEng<<(int) dv->getType();
            serEng<<dv;
        }
    }
    else
    {
        serEng<<DV_ZERO;
    }

}